

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O1

int32_t __thiscall
icu_63::MessagePattern::parsePluralOrSelectStyle
          (MessagePattern *this,UMessagePatternArgType argType,int32_t index,int32_t nestingLevel,
          UParseError *parseError,UErrorCode *errorCode)

{
  char16_t *pcVar1;
  ushort uVar2;
  short sVar3;
  UErrorCode UVar4;
  bool bVar5;
  bool bVar6;
  int8_t iVar7;
  uint index_00;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  char16_t *pcVar13;
  char cVar14;
  uint uVar15;
  bool bVar16;
  
  uVar15 = 0;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    pcVar1 = (char16_t *)((long)&(this->msg).fUnion + 2);
    bVar5 = true;
    bVar6 = false;
    uVar8 = index;
    do {
      index_00 = skipWhiteSpace(this,uVar8);
      uVar2 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
      if ((short)uVar2 < 0) {
        uVar10 = (this->msg).fUnion.fFields.fLength;
      }
      else {
        uVar10 = (int)(short)uVar2 >> 5;
      }
      if (index_00 == uVar10) {
LAB_002918bf:
        bVar16 = true;
        if (nestingLevel < 1) {
          bVar16 = ((this->partsList->super_MessagePatternList<icu_63::MessagePattern::Part,_32>).a.
                   ptr)->type == UMSGPAT_PART_TYPE_MSG_START;
        }
        uVar8 = index_00;
        if (bVar16 == (index_00 == uVar10)) {
          setParseError(this,parseError,index);
          *errorCode = U_PATTERN_SYNTAX_ERROR;
          cVar14 = '\x01';
          uVar15 = 0;
        }
        else {
          cVar14 = '\x01';
          if (bVar6) {
            bVar6 = true;
            uVar15 = index_00;
          }
          else {
            bVar6 = false;
            setParseError(this,parseError,0);
            *errorCode = U_DEFAULT_KEYWORD_MISSING;
            uVar15 = 0;
          }
        }
      }
      else {
        if (index_00 < uVar10) {
          pcVar13 = pcVar1;
          if ((uVar2 & 2) == 0) {
            pcVar13 = (this->msg).fUnion.fFields.fArray;
          }
          if (pcVar13[(int)index_00] == L'}') goto LAB_002918bf;
        }
        if (((argType == UMSGPAT_ARG_TYPE_SELECTORDINAL) || (argType == UMSGPAT_ARG_TYPE_PLURAL)) &&
           (index_00 < uVar10)) {
          pcVar13 = pcVar1;
          if ((uVar2 & 2) == 0) {
            pcVar13 = (this->msg).fUnion.fFields.fArray;
          }
          if (pcVar13[(int)index_00] != L'=') goto LAB_002919ad;
          uVar8 = skipDouble(this,index_00 + 1);
          iVar11 = uVar8 - index_00;
          if (iVar11 == 1) {
            setParseError(this,parseError,index);
            *errorCode = U_PATTERN_SYNTAX_ERROR;
LAB_00291b09:
            bVar16 = false;
            uVar15 = 0;
          }
          else {
            if (0xffff < iVar11) {
              setParseError(this,parseError,index_00);
              *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
              goto LAB_00291b09;
            }
            addPart(this,UMSGPAT_PART_TYPE_ARG_SELECTOR,index_00,iVar11,0,errorCode);
            parseDouble(this,index_00 + 1,uVar8,'\0',parseError,errorCode);
            bVar16 = true;
          }
          cVar14 = '\x01';
          uVar10 = uVar15;
          if (!bVar16) goto LAB_00291c0b;
        }
        else {
LAB_002919ad:
          uVar8 = skipIdentifier(this,index_00);
          iVar11 = uVar8 - index_00;
          if (iVar11 == 0) {
            setParseError(this,parseError,index);
            *errorCode = U_PATTERN_SYNTAX_ERROR;
LAB_00291a86:
            cVar14 = '\x01';
            uVar15 = 0;
          }
          else if (iVar11 == 6 && (argType - UMSGPAT_ARG_TYPE_PLURAL & 0xfffffffd) == 0) {
            sVar3 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
            if (sVar3 < 0) {
              iVar9 = (this->msg).fUnion.fFields.fLength;
            }
            else {
              iVar9 = (int)sVar3 >> 5;
            }
            if ((iVar9 <= (int)uVar8) ||
               (iVar7 = UnicodeString::doCompare(&this->msg,index_00,7,(UChar *)kOffsetColon,0,7),
               iVar7 != '\0')) goto LAB_00291a60;
            if (bVar5) {
              uVar10 = skipWhiteSpace(this,uVar8 + 1);
              uVar8 = skipDouble(this,uVar10);
              if (uVar8 == uVar10) {
                setParseError(this,parseError,index);
                *errorCode = U_PATTERN_SYNTAX_ERROR;
              }
              else {
                if ((int)(uVar8 - uVar10) < 0x10000) {
                  parseDouble(this,uVar10,uVar8,'\0',parseError,errorCode);
                  UVar4 = *errorCode;
                  bVar5 = U_ZERO_ERROR < UVar4;
                  cVar14 = (UVar4 < U_ILLEGAL_ARGUMENT_ERROR) * '\x02' + '\x01';
                  if (U_ZERO_ERROR < UVar4) {
                    uVar15 = 0;
                  }
                  goto LAB_00291add;
                }
                setParseError(this,parseError,uVar10);
                *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
              }
              bVar5 = true;
              goto LAB_00291a86;
            }
            setParseError(this,parseError,index);
            *errorCode = U_PATTERN_SYNTAX_ERROR;
            bVar5 = false;
            cVar14 = '\x01';
            uVar15 = 0;
          }
          else {
LAB_00291a60:
            if (0xffff < iVar11) {
              setParseError(this,parseError,index_00);
              *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
              goto LAB_00291a86;
            }
            cVar14 = '\0';
            addPart(this,UMSGPAT_PART_TYPE_ARG_SELECTOR,index_00,iVar11,0,errorCode);
            iVar7 = UnicodeString::doCompare(&this->msg,index_00,iVar11,(UChar *)kOther,0,5);
            if (iVar7 == '\0') {
              bVar6 = true;
            }
          }
LAB_00291add:
          uVar10 = uVar15;
          if (cVar14 != '\0') goto LAB_00291c0b;
        }
        cVar14 = '\x01';
        uVar15 = 0;
        if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
          uVar8 = skipWhiteSpace(this,uVar8);
          sVar3 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
          if (sVar3 < 0) {
            uVar12 = (this->msg).fUnion.fFields.fLength;
          }
          else {
            uVar12 = (int)sVar3 >> 5;
          }
          if (uVar8 < uVar12) {
            pcVar13 = pcVar1;
            if (((int)sVar3 & 2U) == 0) {
              pcVar13 = (this->msg).fUnion.fFields.fArray;
            }
            if (pcVar13[(int)uVar8] == L'{') {
              uVar8 = parseMessage(this,uVar8,1,nestingLevel + 1,argType,parseError,errorCode);
              UVar4 = *errorCode;
              if (UVar4 < U_ILLEGAL_ARGUMENT_ERROR) {
                bVar5 = false;
              }
              cVar14 = U_ZERO_ERROR < UVar4;
              uVar15 = uVar10;
              if (U_ZERO_ERROR < UVar4) {
                uVar15 = 0;
              }
              goto LAB_00291c0b;
            }
          }
          setParseError(this,parseError,index_00);
          *errorCode = U_PATTERN_SYNTAX_ERROR;
        }
      }
LAB_00291c0b:
    } while ((cVar14 == '\0') || (cVar14 == '\x03'));
  }
  return uVar15;
}

Assistant:

int32_t
MessagePattern::parsePluralOrSelectStyle(UMessagePatternArgType argType,
                                         int32_t index, int32_t nestingLevel,
                                         UParseError *parseError, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        return 0;
    }
    int32_t start=index;
    UBool isEmpty=TRUE;
    UBool hasOther=FALSE;
    for(;;) {
        // First, collect the selector looking for a small set of terminators.
        // It would be a little faster to consider the syntax of each possible
        // token right here, but that makes the code too complicated.
        index=skipWhiteSpace(index);
        UBool eos=index==msg.length();
        if(eos || msg.charAt(index)==u_rightCurlyBrace) {
            if(eos==inMessageFormatPattern(nestingLevel)) {
                setParseError(parseError, start);  // Bad plural/select pattern syntax.
                errorCode=U_PATTERN_SYNTAX_ERROR;
                return 0;
            }
            if(!hasOther) {
                setParseError(parseError, 0);  // Missing 'other' keyword in plural/select pattern.
                errorCode=U_DEFAULT_KEYWORD_MISSING;
                return 0;
            }
            return index;
        }
        int32_t selectorIndex=index;
        if(UMSGPAT_ARG_TYPE_HAS_PLURAL_STYLE(argType) && msg.charAt(selectorIndex)==u_equal) {
            // explicit-value plural selector: =double
            index=skipDouble(index+1);
            int32_t length=index-selectorIndex;
            if(length==1) {
                setParseError(parseError, start);  // Bad plural/select pattern syntax.
                errorCode=U_PATTERN_SYNTAX_ERROR;
                return 0;
            }
            if(length>Part::MAX_LENGTH) {
                setParseError(parseError, selectorIndex);  // Argument selector too long.
                errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                return 0;
            }
            addPart(UMSGPAT_PART_TYPE_ARG_SELECTOR, selectorIndex, length, 0, errorCode);
            parseDouble(selectorIndex+1, index, FALSE,
                        parseError, errorCode);  // adds ARG_INT or ARG_DOUBLE
        } else {
            index=skipIdentifier(index);
            int32_t length=index-selectorIndex;
            if(length==0) {
                setParseError(parseError, start);  // Bad plural/select pattern syntax.
                errorCode=U_PATTERN_SYNTAX_ERROR;
                return 0;
            }
            // Note: The ':' in "offset:" is just beyond the skipIdentifier() range.
            if( UMSGPAT_ARG_TYPE_HAS_PLURAL_STYLE(argType) && length==6 && index<msg.length() &&
                0==msg.compare(selectorIndex, 7, kOffsetColon, 0, 7)
            ) {
                // plural offset, not a selector
                if(!isEmpty) {
                    // Plural argument 'offset:' (if present) must precede key-message pairs.
                    setParseError(parseError, start);
                    errorCode=U_PATTERN_SYNTAX_ERROR;
                    return 0;
                }
                // allow whitespace between offset: and its value
                int32_t valueIndex=skipWhiteSpace(index+1);  // The ':' is at index.
                index=skipDouble(valueIndex);
                if(index==valueIndex) {
                    setParseError(parseError, start);  // Missing value for plural 'offset:'.
                    errorCode=U_PATTERN_SYNTAX_ERROR;
                    return 0;
                }
                if((index-valueIndex)>Part::MAX_LENGTH) {
                    setParseError(parseError, valueIndex);  // Plural offset value too long.
                    errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                    return 0;
                }
                parseDouble(valueIndex, index, FALSE,
                            parseError, errorCode);  // adds ARG_INT or ARG_DOUBLE
                if(U_FAILURE(errorCode)) {
                    return 0;
                }
                isEmpty=FALSE;
                continue;  // no message fragment after the offset
            } else {
                // normal selector word
                if(length>Part::MAX_LENGTH) {
                    setParseError(parseError, selectorIndex);  // Argument selector too long.
                    errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                    return 0;
                }
                addPart(UMSGPAT_PART_TYPE_ARG_SELECTOR, selectorIndex, length, 0, errorCode);
                if(0==msg.compare(selectorIndex, length, kOther, 0, 5)) {
                    hasOther=TRUE;
                }
            }
        }
        if(U_FAILURE(errorCode)) {
            return 0;
        }

        // parse the message fragment following the selector
        index=skipWhiteSpace(index);
        if(index==msg.length() || msg.charAt(index)!=u_leftCurlyBrace) {
            setParseError(parseError, selectorIndex);  // No message fragment after plural/select selector.
            errorCode=U_PATTERN_SYNTAX_ERROR;
            return 0;
        }
        index=parseMessage(index, 1, nestingLevel+1, argType, parseError, errorCode);
        if(U_FAILURE(errorCode)) {
            return 0;
        }
        isEmpty=FALSE;
    }
}